

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreenintegration.cpp
# Opt level: O2

void __thiscall
QOffscreenIntegration::QOffscreenIntegration(QOffscreenIntegration *this,QStringList *paramList)

{
  QPlatformFontDatabase *other;
  QPlatformDrag *other_00;
  long in_FS_OFFSET;
  undefined1 auStack_48 [8];
  QJsonObject config;
  QScopedPointer<QPlatformServices,_QScopedPointerDeleter<QPlatformServices>_> local_28;
  
  local_28.d = *(QPlatformServices **)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR__QOffscreenIntegration_0011cf38;
  (this->m_fontDatabase).d = (QPlatformFontDatabase *)0x0;
  (this->m_drag).d = (QPlatformDrag *)0x0;
  (this->m_inputContext).d = (QPlatformInputContext *)0x0;
  (this->m_services).d = (QPlatformServices *)0x0;
  (this->m_nativeInterface).d = (QPlatformNativeInterface *)0x0;
  (this->m_screens).d.d = (Data *)0x0;
  (this->m_screens).d.ptr = (QOffscreenScreen **)0x0;
  (this->m_screens).d.size = 0;
  this->m_windowFrameMarginsEnabled = true;
  QJsonObject::QJsonObject(&this->m_configuration);
  other = (QPlatformFontDatabase *)operator_new(8);
  *(code **)other = QPlatformNativeInterface::windowProperty;
  QScopedPointer<QPlatformFontDatabase,_QScopedPointerDeleter<QPlatformFontDatabase>_>::reset
            (&this->m_fontDatabase,other);
  other_00 = (QPlatformDrag *)operator_new(0x10);
  QOffscreenDrag::QOffscreenDrag((QOffscreenDrag *)other_00);
  QScopedPointer<QPlatformDrag,_QScopedPointerDeleter<QPlatformDrag>_>::reset
            (&this->m_drag,other_00);
  _config = (QPlatformFontDatabase *)0xaaaaaaaaaaaaaaaa;
  resolveConfigFileConfiguration
            ((QOffscreenIntegration *)&stack0xffffffffffffffc8,(QStringList *)other_00);
  defaultConfiguration((QOffscreenIntegration *)auStack_48);
  std::optional<QJsonObject>::value_or<QJsonObject>
            ((optional<QJsonObject> *)&config,(QJsonObject *)&stack0xffffffffffffffc8);
  QJsonObject::~QJsonObject((QJsonObject *)auStack_48);
  std::_Optional_payload_base<QJsonObject>::_M_reset
            ((_Optional_payload_base<QJsonObject> *)&stack0xffffffffffffffc8);
  setConfiguration(this,&config);
  QJsonObject::~QJsonObject(&config);
  if (*(QPlatformServices **)(in_FS_OFFSET + 0x28) == local_28.d) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QOffscreenIntegration::QOffscreenIntegration(const QStringList& paramList)
{
#if defined(Q_OS_UNIX)
#if defined(Q_OS_MAC)
    m_fontDatabase.reset(new QCoreTextFontDatabaseEngineFactory<QCoreTextFontEngine>);
#else
    m_fontDatabase.reset(new QGenericUnixFontDatabase());
#endif
#elif defined(Q_OS_WIN)
    m_fontDatabase.reset(new QFreeTypeFontDatabase());
#endif

#if QT_CONFIG(draganddrop)
    m_drag.reset(new QOffscreenDrag);
#endif

    QJsonObject config = resolveConfigFileConfiguration(paramList).value_or(defaultConfiguration());
    setConfiguration(config);
}